

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O2

uint mmap_get_section_size(gbspace_t sect)

{
  uint uVar1;
  
  uVar1 = 0;
  if (sect < out_of_mmap) {
    uVar1 = *(uint *)(&DAT_0010d4f0 + (ulong)sect * 4);
  }
  return uVar1;
}

Assistant:

unsigned mmap_get_section_size(gbspace_t sect)
{
    switch (sect)
    {
        case rom_0:    return ROM_BANK_SIZE;
        case rom_n:    return ROM_BANK_SIZE;
        case vram:     return VRAM_BANK_SIZE;
        case ram:      return RAM_BANK_SIZE;
        case wram_0:   return WRAM_BANK_SIZE;
        case wram_n:   return WRAM_BANK_SIZE;
        case echo:     return 0x1E00;
        case oam:      return 0x00A0;
        case unusable: return 0x0060;
        case io:       return 0x0080;
        case hram:     return 0x007F;
        case ie:       return 0x0001;
        default:       return 0;
    }
}